

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

bool __thiscall cmArchiveWrite::AddData(cmArchiveWrite *this,char *file,size_t size)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  long lVar3;
  size_t sVar4;
  size_t local_42e0;
  string local_42c0 [32];
  string local_42a0;
  size_t local_4280;
  ssize_type nnext_s;
  size_t nnext;
  size_t nleft;
  char buffer [16384];
  string local_260 [48];
  long local_230;
  ifstream fin;
  size_t size_local;
  char *file_local;
  cmArchiveWrite *this_local;
  
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&local_230,file,_Var2);
  bVar1 = std::ios::operator!((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
  sVar4 = size;
  if ((bVar1 & 1) == 0) {
    while (nnext = sVar4, nnext != 0) {
      if (nnext < 0x4001) {
        local_42e0 = nnext;
      }
      else {
        local_42e0 = 0x4000;
      }
      nnext_s = local_42e0;
      local_4280 = local_42e0;
      std::istream::read((char *)&local_230,(long)&nleft);
      lVar3 = std::istream::gcount();
      if (lVar3 != nnext_s) break;
      sVar4 = archive_write_data(this->Archive,&nleft,nnext_s);
      if (sVar4 != local_4280) {
        std::__cxx11::string::operator=((string *)&this->Error,"archive_write_data: ");
        cm_archive_error_string_abi_cxx11_(&local_42a0,this->Archive);
        std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_42a0);
        std::__cxx11::string::~string((string *)&local_42a0);
        this_local._7_1_ = false;
        goto LAB_00167b28;
      }
      sVar4 = nnext - nnext_s;
    }
    if (nnext == 0) {
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Error,"Error reading \"");
      std::__cxx11::string::operator+=((string *)&this->Error,file);
      std::__cxx11::string::operator+=((string *)&this->Error,"\": ");
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::string::operator+=((string *)&this->Error,local_42c0);
      std::__cxx11::string::~string(local_42c0);
      this_local._7_1_ = false;
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->Error,"Error opening \"");
    std::__cxx11::string::operator+=((string *)&this->Error,file);
    std::__cxx11::string::operator+=((string *)&this->Error,"\": ");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::string::operator+=((string *)&this->Error,local_260);
    std::__cxx11::string::~string(local_260);
    this_local._7_1_ = false;
  }
LAB_00167b28:
  buffer[0x3ffc] = '\x01';
  buffer[0x3ffd] = '\0';
  buffer[0x3ffe] = '\0';
  buffer[0x3fff] = '\0';
  std::ifstream::~ifstream(&local_230);
  return this_local._7_1_;
}

Assistant:

bool cmArchiveWrite::AddData(const char* file, size_t size)
{
  cmsys::ifstream fin(file, std::ios::in | cmsys_ios_binary);
  if(!fin)
    {
    this->Error = "Error opening \"";
    this->Error += file;
    this->Error += "\": ";
    this->Error += cmSystemTools::GetLastSystemError();
    return false;
    }

  char buffer[16384];
  size_t nleft = size;
  while(nleft > 0)
    {
    typedef cmsys_ios::streamsize ssize_type;
    size_t const nnext = nleft > sizeof(buffer)? sizeof(buffer) : nleft;
    ssize_type const nnext_s = static_cast<ssize_type>(nnext);
    fin.read(buffer, nnext_s);
    // Some stream libraries (older HPUX) return failure at end of
    // file on the last read even if some data were read.  Check
    // gcount instead of trusting the stream error status.
    if(static_cast<size_t>(fin.gcount()) != nnext)
      {
      break;
      }
    if(archive_write_data(this->Archive, buffer, nnext) != nnext_s)
      {
      this->Error = "archive_write_data: ";
      this->Error += cm_archive_error_string(this->Archive);
      return false;
      }
    nleft -= nnext;
    }
  if(nleft > 0)
    {
    this->Error = "Error reading \"";
    this->Error += file;
    this->Error += "\": ";
    this->Error += cmSystemTools::GetLastSystemError();
    return false;
    }
  return true;
}